

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O0

uint32_t __thiscall Rel::toDot(Rel *this,stringstream *ss)

{
  uint uVar1;
  size_t sVar2;
  ostream *poVar3;
  element_type *peVar4;
  element_type *peVar5;
  string local_40 [36];
  uint local_1c;
  stringstream *psStack_18;
  uint32_t i;
  stringstream *ss_local;
  Rel *this_local;
  
  psStack_18 = ss;
  ss_local = (stringstream *)this;
  sVar2 = std::hash<Node_*>::operator()((hash<Node_*> *)&Node::hash,(Node *)this);
  local_1c = (uint)sVar2;
  poVar3 = std::operator<<((ostream *)(psStack_18 + 0x10),'\t');
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
  poVar3 = std::operator<<(poVar3,' ');
  poVar3 = std::operator<<(poVar3,"[shape=box, label=\"Rel\\nop: ");
  peVar4 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(this->super_Logical).super_Expr.op);
  (**peVar4->_vptr_Token)();
  poVar3 = std::operator<<(poVar3,local_40);
  poVar3 = std::operator<<(poVar3,"\"");
  poVar3 = std::operator<<(poVar3,", fillcolor=\"#e3f2fd\", style=filled]");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_40);
  poVar3 = std::operator<<((ostream *)(psStack_18 + 0x10),'\t');
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
  poVar3 = std::operator<<(poVar3," -> ");
  peVar5 = std::__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(this->super_Logical).expr1);
  uVar1 = (*(peVar5->super_Node)._vptr_Node[1])(peVar5,psStack_18);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)(psStack_18 + 0x10),'\t');
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
  poVar3 = std::operator<<(poVar3," -> ");
  peVar5 = std::__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(this->super_Logical).expr2);
  uVar1 = (*(peVar5->super_Node)._vptr_Node[1])(peVar5,psStack_18);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return local_1c;
}

Assistant:

uint32_t toDot(std::stringstream& ss) override {
		uint32_t i = hash(this);

		ss << '\t' << i << ' ' << "[shape=box, label=\"Rel\\nop: " << op->toString() << "\"" << ", fillcolor=\"#e3f2fd\", style=filled]" << std::endl;

		ss << '\t' << i << " -> " << expr1->toDot(ss) << std::endl;;
		ss << '\t' << i << " -> " << expr2->toDot(ss) << std::endl;;

		return i;
	}